

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

pdf_obj * pdf_new_array(hd_context *ctx,pdf_document *doc,int initialcap)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_obj *p;
  void *pvVar3;
  pdf_obj local_30;
  int local_2c;
  int i;
  pdf_obj_array *obj;
  int initialcap_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  p = (pdf_obj *)hd_malloc(ctx,0x28);
  p->refs = 1;
  p->kind = 'a';
  p->flags = '\0';
  *(pdf_document **)(p + 2) = doc;
  p[4].refs = 0;
  p[4].kind = '\0';
  p[4].flags = '\0';
  p[5].refs = 0;
  p[5].kind = '\0';
  p[5].flags = '\0';
  local_30 = (pdf_obj)initialcap;
  if (initialcap < 2) {
    local_30.refs = 6;
    local_30.kind = '\0';
    local_30.flags = '\0';
  }
  p[6] = local_30;
  iVar2 = hd_push_try(ctx);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
    pvVar3 = hd_malloc_array(ctx,(long)(int)p[6],8);
    *(void **)(p + 8) = pvVar3;
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    for (local_2c = 0; local_2c < (int)p[6]; local_2c = local_2c + 1) {
      *(undefined8 *)(*(long *)(p + 8) + (long)local_2c * 8) = 0;
    }
    return p;
  }
  hd_free(ctx,p);
  hd_rethrow(ctx);
}

Assistant:

pdf_obj *
pdf_new_array(hd_context *ctx, pdf_document *doc, int initialcap)
{
    pdf_obj_array *obj;
    int i;

    obj = Memento_label(hd_malloc(ctx, sizeof(pdf_obj_array)), "pdf_obj(array)");
    obj->super.refs = 1;
    obj->super.kind = PDF_ARRAY;
    obj->super.flags = 0;
    obj->doc = doc;
    obj->parent_num = 0;

    obj->len = 0;
    obj->cap = initialcap > 1 ? initialcap : 6;

    hd_try(ctx)
    {
        obj->items = Memento_label(hd_malloc_array(ctx, obj->cap, sizeof(pdf_obj*)), "pdf_obj(array items)");
    }
    hd_catch(ctx)
    {
        hd_free(ctx, obj);
        hd_rethrow(ctx);
    }
    for (i = 0; i < obj->cap; i++)
        obj->items[i] = NULL;

    return &obj->super;
}